

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O2

int intra_mode_info_cost_y
              (AV1_COMP *cpi,MACROBLOCK *x,MB_MODE_INFO *mbmi,BLOCK_SIZE bsize,int mode_cost,
              int discount_color_cost)

{
  byte bVar1;
  byte bVar2;
  BLOCK_SIZE bs;
  ushort uVar3;
  MB_MODE_INFO *pMVar4;
  MB_MODE_INFO *pMVar5;
  byte *pbVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int cols;
  int rows;
  int block_height;
  int block_width;
  uint16_t color_cache [16];
  int *in_stack_ffffffffffffff58;
  int local_68;
  int local_64;
  int local_60;
  
  bVar1 = (mbmi->palette_mode_info).palette_size[0];
  uVar12 = (ulong)(mbmi->filter_intra_mode_info).use_filter_intra;
  uVar3 = *(ushort *)&mbmi->field_0xa7;
  iVar7 = av1_allow_palette((uint)(cpi->common).features.allow_screen_content_tools,mbmi->bsize);
  if ((iVar7 != 0) && (mbmi->mode == '\0')) {
    bVar2 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[bsize];
    pMVar4 = (x->e_mbd).left_mbmi;
    pMVar5 = (x->e_mbd).above_mbmi;
    uVar8 = 0;
    if (pMVar5 != (MB_MODE_INFO *)0x0) {
      uVar8 = (uint)((pMVar5->palette_mode_info).palette_size[0] != '\0');
    }
    if (pMVar4 != (MB_MODE_INFO *)0x0) {
      uVar8 = (uVar8 + 1) - (uint)((pMVar4->palette_mode_info).palette_size[0] == '\0');
    }
    mode_cost = mode_cost +
                (x->mode_costs).palette_uv_color_cost[6][0]
                [(ulong)bVar2 * 6 + (ulong)uVar8 * 2 + (ulong)(bVar1 != 0) + 4];
    if (bVar1 != 0) {
      pbVar6 = (x->e_mbd).plane[0].color_index_map;
      av1_get_block_dimensions
                (bsize,(int)&x->e_mbd,(MACROBLOCKD *)&stack0xffffffffffffffa4,&local_60,&local_64,
                 &local_68,in_stack_ffffffffffffff58);
      iVar7 = (x->mode_costs).cfl_cost[6][1][(ulong)bVar2 * 7 + (ulong)bVar1 + 6];
      iVar9 = write_uniform_cost((uint)bVar1,(uint)*pbVar6);
      iVar10 = av1_get_palette_cache(&x->e_mbd,0,(uint16_t *)&stack0xffffffffffffffa8);
      iVar10 = av1_palette_color_cost_y
                         (&mbmi->palette_mode_info,(uint16_t *)&stack0xffffffffffffffa8,iVar10,
                          ((cpi->common).seq_params)->bit_depth);
      iVar11 = av1_cost_color_map(x,0,bsize,mbmi->tx_size,'\0');
      mode_cost = mode_cost + iVar7 + iVar10 + iVar9 + iVar11;
    }
  }
  bVar1 = mbmi->mode;
  if (((ulong)bVar1 == 0) && ((mbmi->palette_mode_info).palette_size[0] == '\0')) {
    bs = mbmi->bsize;
    iVar7 = av1_filter_intra_allowed_bsize(&cpi->common,bs);
    if ((iVar7 != 0) &&
       (mode_cost = mode_cost + (x->mode_costs).filter_intra_cost[bs][uVar12], uVar12 != 0)) {
      mode_cost = mode_cost +
                  (x->mode_costs).filter_intra_mode_cost
                  [(mbmi->filter_intra_mode_info).filter_intra_mode];
    }
  }
  if ((BLOCK_8X4 < bsize) && (0xf7 < (byte)(bVar1 - 9))) {
    mode_cost = mode_cost +
                (x->mode_costs).angle_delta_cost[(ulong)bVar1 - 1][(long)mbmi->angle_delta[0] + 3];
  }
  if (((((cpi->common).current_frame.frame_type & 0xfd) == 0) &&
      ((cpi->common).features.allow_screen_content_tools == true)) &&
     ((cpi->common).features.allow_intrabc != false)) {
    mode_cost = mode_cost + (x->mode_costs).intrabc_cost[uVar3 >> 7 & 1];
  }
  return mode_cost;
}

Assistant:

static inline int intra_mode_info_cost_y(const AV1_COMP *cpi,
                                         const MACROBLOCK *x,
                                         const MB_MODE_INFO *mbmi,
                                         BLOCK_SIZE bsize, int mode_cost,
                                         int discount_color_cost) {
  int total_rate = mode_cost;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int use_palette = mbmi->palette_mode_info.palette_size[0] > 0;
  const int use_filter_intra = mbmi->filter_intra_mode_info.use_filter_intra;
  const int use_intrabc = mbmi->use_intrabc;
  // Can only activate one mode.
  assert(((mbmi->mode != DC_PRED) + use_palette + use_intrabc +
          use_filter_intra) <= 1);
  const int try_palette = av1_allow_palette(
      cpi->common.features.allow_screen_content_tools, mbmi->bsize);
  if (try_palette && mbmi->mode == DC_PRED) {
    const MACROBLOCKD *xd = &x->e_mbd;
    const int bsize_ctx = av1_get_palette_bsize_ctx(bsize);
    const int mode_ctx = av1_get_palette_mode_ctx(xd);
    total_rate +=
        mode_costs->palette_y_mode_cost[bsize_ctx][mode_ctx][use_palette];
    if (use_palette) {
      const uint8_t *const color_map = xd->plane[0].color_index_map;
      int block_width, block_height, rows, cols;
      av1_get_block_dimensions(bsize, 0, xd, &block_width, &block_height, &rows,
                               &cols);
      const int plt_size = mbmi->palette_mode_info.palette_size[0];
      int palette_mode_cost =
          mode_costs
              ->palette_y_size_cost[bsize_ctx][plt_size - PALETTE_MIN_SIZE] +
          write_uniform_cost(plt_size, color_map[0]);
      uint16_t color_cache[2 * PALETTE_MAX_SIZE];
      const int n_cache = av1_get_palette_cache(xd, 0, color_cache);
      palette_mode_cost +=
          av1_palette_color_cost_y(&mbmi->palette_mode_info, color_cache,
                                   n_cache, cpi->common.seq_params->bit_depth);
      if (!discount_color_cost)
        palette_mode_cost +=
            av1_cost_color_map(x, 0, bsize, mbmi->tx_size, PALETTE_MAP);

      total_rate += palette_mode_cost;
    }
  }
  if (av1_filter_intra_allowed(&cpi->common, mbmi)) {
    total_rate += mode_costs->filter_intra_cost[mbmi->bsize][use_filter_intra];
    if (use_filter_intra) {
      total_rate +=
          mode_costs->filter_intra_mode_cost[mbmi->filter_intra_mode_info
                                                 .filter_intra_mode];
    }
  }
  if (av1_is_directional_mode(mbmi->mode)) {
    if (av1_use_angle_delta(bsize)) {
      total_rate +=
          mode_costs->angle_delta_cost[mbmi->mode - V_PRED]
                                      [MAX_ANGLE_DELTA +
                                       mbmi->angle_delta[PLANE_TYPE_Y]];
    }
  }
  if (av1_allow_intrabc(&cpi->common))
    total_rate += mode_costs->intrabc_cost[use_intrabc];
  return total_rate;
}